

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::CopyProducerPageIntoLogBuffer
          (TracingServiceImpl *this,ProducerID producer_id_trusted,uid_t producer_uid_trusted,
          pid_t producer_pid_trusted,WriterID writer_id,ChunkID chunk_id,BufferID buffer_id,
          uint16_t num_fragments,uint8_t chunk_flags,bool chunk_complete,uint8_t *src,size_t size)

{
  bool chunk_complete_00;
  ushort uVar1;
  bool bVar2;
  ProducerEndpointImpl *this_00;
  char *pcVar3;
  unsigned_short *puVar4;
  undefined1 local_4c [8];
  Optional<unsigned_short> associated_buffer;
  TraceBuffer *buf;
  ProducerEndpointImpl *producer;
  bool chunk_complete_local;
  ChunkID chunk_id_local;
  WriterID writer_id_local;
  pid_t producer_pid_trusted_local;
  uid_t producer_uid_trusted_local;
  ProducerID producer_id_trusted_local;
  TracingServiceImpl *this_local;
  
  chunk_complete_00 = chunk_complete;
  producer_pid_trusted_local._2_2_ = producer_id_trusted;
  _producer_uid_trusted_local = this;
  this_00 = GetProducer(this,producer_id_trusted);
  if (this_00 == (ProducerEndpointImpl *)0x0) {
    perfetto::base::ignore_result<char[20]>((char (*) [20])"Producer not found.");
    this->chunks_discarded_ = this->chunks_discarded_ + 1;
  }
  else {
    register0x00000000 = GetBufferByID(this,buffer_id);
    if (register0x00000000 == (TraceBuffer *)0x0) {
      perfetto::base::ignore_result<char[48],unsigned_short,unsigned_short>
                ((char (*) [48])"Could not find target buffer %u for producer %u",&buffer_id,
                 (unsigned_short *)((long)&producer_pid_trusted_local + 2));
      this->chunks_discarded_ = this->chunks_discarded_ + 1;
    }
    else {
      bVar2 = ProducerEndpointImpl::is_allowed_target_buffer(this_00,buffer_id);
      if (bVar2) {
        ProducerEndpointImpl::buffer_id_for_writer
                  ((ProducerEndpointImpl *)local_4c,(WriterID)this_00);
        bVar2 = perfetto::base::Optional::operator_cast_to_bool((Optional *)local_4c);
        if ((bVar2) &&
           (puVar4 = perfetto::base::Optional<unsigned_short>::operator*
                               ((Optional<unsigned_short> *)local_4c), *puVar4 != buffer_id)) {
          pcVar3 = perfetto::base::Basename
                             (
                             "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                             );
          uVar1 = producer_pid_trusted_local._2_2_;
          puVar4 = perfetto::base::Optional<unsigned_short>::operator*
                             ((Optional<unsigned_short> *)local_4c);
          perfetto::base::LogMessage
                    (kLogError,pcVar3,0xe5d9,
                     "Writer %u of producer %u was registered to write into target buffer %u, but tried to write into buffer %u"
                     ,(ulong)writer_id,(ulong)uVar1,(uint)*puVar4,(uint)buffer_id);
          perfetto::base::ignore_result<char[20]>((char (*) [20])"Wrong target buffer");
          this->chunks_discarded_ = this->chunks_discarded_ + 1;
        }
        else {
          TraceBuffer::CopyChunkUntrusted
                    (stack0xffffffffffffffb8,producer_pid_trusted_local._2_2_,producer_uid_trusted,
                     producer_pid_trusted,writer_id,chunk_id,num_fragments,chunk_flags,
                     chunk_complete_00,src,size);
        }
      }
      else {
        pcVar3 = perfetto::base::Basename
                           (
                           "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                           );
        perfetto::base::LogMessage
                  (kLogError,pcVar3,0xe5ca,
                   "Producer %u tried to write into forbidden target buffer %u",
                   (ulong)producer_pid_trusted_local._2_2_,(ulong)buffer_id);
        perfetto::base::ignore_result<char[24]>((char (*) [24])"Forbidden target buffer");
        this->chunks_discarded_ = this->chunks_discarded_ + 1;
      }
    }
  }
  return;
}

Assistant:

void TracingServiceImpl::CopyProducerPageIntoLogBuffer(
    ProducerID producer_id_trusted,
    uid_t producer_uid_trusted,
    pid_t producer_pid_trusted,
    WriterID writer_id,
    ChunkID chunk_id,
    BufferID buffer_id,
    uint16_t num_fragments,
    uint8_t chunk_flags,
    bool chunk_complete,
    const uint8_t* src,
    size_t size) {
  PERFETTO_DCHECK_THREAD(thread_checker_);

  ProducerEndpointImpl* producer = GetProducer(producer_id_trusted);
  if (!producer) {
    PERFETTO_DFATAL("Producer not found.");
    chunks_discarded_++;
    return;
  }

  TraceBuffer* buf = GetBufferByID(buffer_id);
  if (!buf) {
    PERFETTO_DLOG("Could not find target buffer %" PRIu16
                  " for producer %" PRIu16,
                  buffer_id, producer_id_trusted);
    chunks_discarded_++;
    return;
  }

  // Verify that the producer is actually allowed to write into the target
  // buffer specified in the request. This prevents a malicious producer from
  // injecting data into a log buffer that belongs to a tracing session the
  // producer is not part of.
  if (!producer->is_allowed_target_buffer(buffer_id)) {
    PERFETTO_ELOG("Producer %" PRIu16
                  " tried to write into forbidden target buffer %" PRIu16,
                  producer_id_trusted, buffer_id);
    PERFETTO_DFATAL("Forbidden target buffer");
    chunks_discarded_++;
    return;
  }

  // If the writer was registered by the producer, it should only write into the
  // buffer it was registered with.
  base::Optional<BufferID> associated_buffer =
      producer->buffer_id_for_writer(writer_id);
  if (associated_buffer && *associated_buffer != buffer_id) {
    PERFETTO_ELOG("Writer %" PRIu16 " of producer %" PRIu16
                  " was registered to write into target buffer %" PRIu16
                  ", but tried to write into buffer %" PRIu16,
                  writer_id, producer_id_trusted, *associated_buffer,
                  buffer_id);
    PERFETTO_DFATAL("Wrong target buffer");
    chunks_discarded_++;
    return;
  }

  buf->CopyChunkUntrusted(producer_id_trusted, producer_uid_trusted,
                          producer_pid_trusted, writer_id, chunk_id,
                          num_fragments, chunk_flags, chunk_complete, src,
                          size);
}